

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b.c
# Opt level: O3

int blake2b_compress(hash_state *md,uchar *buf)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  
  lVar1 = *(long *)buf;
  lVar2 = *(long *)(buf + 0x10);
  lVar3 = *(long *)(buf + 0x20);
  lVar4 = *(long *)(buf + 0x18);
  uVar17 = (long)md->data + lVar1 + (md->whirlpool).state[3];
  uVar24 = (md->whirlpool).state[0] + (md->whirlpool).state[4] + lVar2;
  uVar30 = (md->whirlpool).state[1] + (md->whirlpool).state[5] + lVar3;
  lVar5 = *(long *)(buf + 8);
  uVar21 = (md->whirlpool).state[7] ^ uVar17 ^ 0x510e527fade682d1;
  uVar26 = (md->sha3).s[8] ^ uVar24 ^ 0x9b05688c2b3e6c1f;
  uVar28 = (md->sha3).s[9] ^ uVar30 ^ 0x1f83d9abfb41bd6b;
  lVar6 = *(long *)(buf + 0x30);
  uVar29 = (md->whirlpool).state[2] + (md->whirlpool).state[6] + lVar6;
  uVar20 = (md->sha3).s[10] ^ uVar29 ^ 0x5be0cd19137e2179;
  lVar7 = *(long *)(buf + 0x28);
  lVar8 = *(long *)(buf + 0x38);
  lVar9 = *(long *)(buf + 0x40);
  lVar10 = *(long *)(buf + 0x48);
  lVar11 = *(long *)(buf + 0x50);
  lVar12 = *(long *)(buf + 0x58);
  lVar13 = *(long *)(buf + 0x60);
  lVar14 = *(long *)(buf + 0x68);
  lVar15 = *(long *)(buf + 0x70);
  lVar16 = *(long *)(buf + 0x78);
  uVar22 = uVar21 >> 0x20 | uVar21 << 0x20;
  uVar19 = uVar22 + 0x6a09e667f3bcc908;
  uVar21 = (md->whirlpool).state[3] ^ uVar19;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar18 = uVar17 + lVar5 + uVar21;
  uVar22 = uVar22 ^ uVar18;
  uVar23 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar19 = uVar19 + uVar23;
  uVar21 = uVar21 ^ uVar19;
  uVar17 = uVar21 >> 0x3f | uVar21 << 1;
  uVar22 = uVar26 >> 0x20 | uVar26 << 0x20;
  uVar26 = uVar22 + 0xbb67ae8584caa73b;
  uVar21 = (md->whirlpool).state[4] ^ uVar26;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar25 = uVar24 + lVar4 + uVar21;
  uVar22 = uVar22 ^ uVar25;
  uVar27 = uVar22 >> 0x10 | uVar22 << 0x30;
  uVar26 = uVar26 + uVar27;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar24 = uVar28 >> 0x20 | uVar28 << 0x20;
  uVar22 = uVar24 + 0x3c6ef372fe94f82b;
  uVar28 = uVar18 + lVar9 + uVar21;
  uVar18 = (md->whirlpool).state[5] ^ uVar22;
  uVar18 = uVar18 >> 0x18 | uVar18 << 0x28;
  uVar31 = uVar30 + lVar7 + uVar18;
  uVar24 = uVar24 ^ uVar31;
  uVar30 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar22 = uVar22 + uVar30;
  uVar18 = uVar18 ^ uVar22;
  uVar24 = uVar18 >> 0x3f | uVar18 << 1;
  uVar20 = uVar20 >> 0x20 | uVar20 << 0x20;
  uVar18 = uVar20 + 0xa54ff53a5f1d36f1;
  uVar32 = (md->whirlpool).state[6] ^ uVar18;
  uVar33 = uVar32 >> 0x18 | uVar32 << 0x28;
  uVar32 = uVar29 + lVar8 + uVar33;
  uVar29 = uVar25 + lVar11 + uVar24;
  uVar20 = uVar20 ^ uVar32;
  uVar20 = uVar20 >> 0x10 | uVar20 << 0x30;
  uVar18 = uVar18 + uVar20;
  uVar20 = uVar20 ^ uVar28;
  uVar23 = uVar23 ^ uVar29;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 >> 0x3f | uVar33 << 1;
  uVar20 = uVar20 >> 0x20 | uVar20 << 0x20;
  uVar22 = uVar22 + uVar20;
  uVar21 = uVar21 ^ uVar22;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar31 = uVar31 + lVar13 + uVar33;
  uVar27 = uVar27 ^ uVar31;
  uVar25 = uVar28 + lVar10 + uVar21;
  uVar20 = uVar20 ^ uVar25;
  uVar28 = uVar20 >> 0x10 | uVar20 << 0x30;
  uVar22 = uVar22 + uVar28;
  uVar21 = uVar21 ^ uVar22;
  uVar20 = uVar21 >> 0x3f | uVar21 << 1;
  uVar23 = uVar23 >> 0x20 | uVar23 << 0x20;
  uVar18 = uVar18 + uVar23;
  uVar24 = uVar24 ^ uVar18;
  uVar21 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar29 = uVar29 + lVar12 + uVar21;
  uVar23 = uVar23 ^ uVar29;
  uVar23 = uVar23 >> 0x10 | uVar23 << 0x30;
  uVar18 = uVar18 + uVar23;
  uVar21 = uVar21 ^ uVar18;
  uVar24 = uVar21 >> 0x3f | uVar21 << 1;
  uVar21 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar32 = uVar32 + lVar15 + uVar17;
  uVar30 = uVar30 ^ uVar32;
  uVar29 = uVar29 + lVar3 + uVar20;
  uVar19 = uVar19 + uVar21;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 >> 0x18 | uVar33 << 0x28;
  uVar31 = uVar31 + lVar14 + uVar33;
  uVar21 = uVar21 ^ uVar31;
  uVar27 = uVar21 >> 0x10 | uVar21 << 0x30;
  uVar19 = uVar19 + uVar27;
  uVar27 = uVar27 ^ uVar29;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 >> 0x3f | uVar33 << 1;
  uVar30 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar31 = uVar31 + lVar10 + uVar24;
  uVar26 = uVar26 + uVar30;
  uVar17 = uVar17 ^ uVar26;
  uVar21 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar17 = uVar32 + lVar16 + uVar21;
  uVar30 = uVar30 ^ uVar17;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x30;
  uVar26 = uVar26 + uVar30;
  uVar30 = uVar30 ^ uVar31;
  uVar32 = uVar17 + lVar14 + uVar33;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar25 = uVar25 + lVar15 + uVar21;
  uVar28 = uVar28 ^ uVar32;
  uVar23 = uVar23 ^ uVar25;
  uVar17 = uVar23 >> 0x20 | uVar23 << 0x20;
  uVar19 = uVar19 + uVar17;
  uVar21 = uVar21 ^ uVar19;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar25 = uVar25 + lVar11 + uVar21;
  uVar17 = uVar17 ^ uVar25;
  uVar23 = uVar17 >> 0x10 | uVar17 << 0x30;
  uVar19 = uVar19 + uVar23;
  uVar21 = uVar21 ^ uVar19;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar27 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar26 = uVar26 + uVar27;
  uVar20 = uVar20 ^ uVar26;
  uVar17 = uVar20 >> 0x18 | uVar20 << 0x28;
  uVar29 = uVar29 + lVar9 + uVar17;
  uVar27 = uVar27 ^ uVar29;
  uVar27 = uVar27 >> 0x10 | uVar27 << 0x30;
  uVar26 = uVar26 + uVar27;
  uVar17 = uVar17 ^ uVar26;
  uVar17 = uVar17 >> 0x3f | uVar17 << 1;
  uVar30 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar25 = uVar25 + lVar5 + uVar17;
  uVar22 = uVar22 + uVar30;
  uVar24 = uVar24 ^ uVar22;
  uVar20 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar31 = uVar31 + lVar16 + uVar20;
  uVar30 = uVar30 ^ uVar31;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x30;
  uVar22 = uVar22 + uVar30;
  uVar20 = uVar20 ^ uVar22;
  uVar20 = uVar20 >> 0x3f | uVar20 << 1;
  uVar24 = uVar28 >> 0x20 | uVar28 << 0x20;
  uVar18 = uVar18 + uVar24;
  uVar29 = uVar29 + lVar1 + uVar20;
  uVar33 = uVar33 ^ uVar18;
  uVar28 = uVar33 >> 0x18 | uVar33 << 0x28;
  uVar32 = uVar32 + lVar6 + uVar28;
  uVar23 = uVar23 ^ uVar29;
  uVar24 = uVar24 ^ uVar32;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar18 = uVar18 + uVar24;
  uVar24 = uVar24 ^ uVar25;
  uVar28 = uVar28 ^ uVar18;
  uVar33 = uVar28 >> 0x3f | uVar28 << 1;
  uVar24 = uVar24 >> 0x20 | uVar24 << 0x20;
  uVar22 = uVar22 + uVar24;
  uVar17 = uVar17 ^ uVar22;
  uVar17 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar31 = uVar31 + lVar12 + uVar33;
  uVar27 = uVar27 ^ uVar31;
  uVar25 = uVar25 + lVar13 + uVar17;
  uVar24 = uVar24 ^ uVar25;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar22 = uVar22 + uVar24;
  uVar17 = uVar17 ^ uVar22;
  uVar17 = uVar17 >> 0x3f | uVar17 << 1;
  uVar28 = uVar23 >> 0x20 | uVar23 << 0x20;
  uVar18 = uVar18 + uVar28;
  uVar20 = uVar20 ^ uVar18;
  uVar20 = uVar20 >> 0x18 | uVar20 << 0x28;
  uVar23 = uVar29 + lVar2 + uVar20;
  uVar28 = uVar28 ^ uVar23;
  uVar28 = uVar28 >> 0x10 | uVar28 << 0x30;
  uVar18 = uVar18 + uVar28;
  uVar20 = uVar20 ^ uVar18;
  uVar20 = uVar20 >> 0x3f | uVar20 << 1;
  uVar29 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar19 = uVar19 + uVar29;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 >> 0x18 | uVar33 << 0x28;
  uVar31 = uVar31 + lVar8 + uVar33;
  uVar32 = uVar32 + lVar7 + uVar21;
  uVar29 = uVar29 ^ uVar31;
  uVar27 = uVar29 >> 0x10 | uVar29 << 0x30;
  uVar19 = uVar19 + uVar27;
  uVar30 = uVar30 ^ uVar32;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 >> 0x3f | uVar33 << 1;
  uVar30 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar29 = uVar23 + lVar13 + uVar17;
  uVar26 = uVar26 + uVar30;
  uVar27 = uVar27 ^ uVar29;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar31 = uVar31 + lVar7 + uVar20;
  uVar32 = uVar32 + lVar4 + uVar21;
  uVar30 = uVar30 ^ uVar32;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x30;
  uVar26 = uVar26 + uVar30;
  uVar30 = uVar30 ^ uVar31;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar23 = uVar25 + lVar12 + uVar21;
  uVar28 = uVar28 ^ uVar23;
  uVar28 = uVar28 >> 0x20 | uVar28 << 0x20;
  uVar19 = uVar19 + uVar28;
  uVar21 = uVar21 ^ uVar19;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar32 = uVar32 + lVar16 + uVar33;
  uVar24 = uVar24 ^ uVar32;
  uVar23 = uVar23 + lVar9 + uVar21;
  uVar28 = uVar28 ^ uVar23;
  uVar28 = uVar28 >> 0x10 | uVar28 << 0x30;
  uVar19 = uVar19 + uVar28;
  uVar21 = uVar21 ^ uVar19;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar27 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar26 = uVar26 + uVar27;
  uVar17 = uVar17 ^ uVar26;
  uVar17 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar25 = uVar29 + lVar1 + uVar17;
  uVar27 = uVar27 ^ uVar25;
  uVar29 = uVar27 >> 0x10 | uVar27 << 0x30;
  uVar26 = uVar26 + uVar29;
  uVar17 = uVar17 ^ uVar26;
  uVar17 = uVar17 >> 0x3f | uVar17 << 1;
  uVar27 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar23 = uVar23 + lVar11 + uVar17;
  uVar22 = uVar22 + uVar27;
  uVar20 = uVar20 ^ uVar22;
  uVar20 = uVar20 >> 0x18 | uVar20 << 0x28;
  uVar31 = uVar31 + lVar2 + uVar20;
  uVar27 = uVar27 ^ uVar31;
  uVar27 = uVar27 >> 0x10 | uVar27 << 0x30;
  uVar22 = uVar22 + uVar27;
  uVar20 = uVar20 ^ uVar22;
  uVar20 = uVar20 >> 0x3f | uVar20 << 1;
  uVar24 = uVar24 >> 0x20 | uVar24 << 0x20;
  uVar25 = uVar25 + lVar4 + uVar20;
  uVar28 = uVar28 ^ uVar25;
  uVar18 = uVar18 + uVar24;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 >> 0x18 | uVar33 << 0x28;
  uVar30 = uVar32 + lVar14 + uVar33;
  uVar24 = uVar24 ^ uVar30;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar18 = uVar18 + uVar24;
  uVar24 = uVar24 ^ uVar23;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 >> 0x3f | uVar33 << 1;
  uVar24 = uVar24 >> 0x20 | uVar24 << 0x20;
  uVar22 = uVar22 + uVar24;
  uVar32 = uVar31 + lVar8 + uVar33;
  uVar17 = uVar17 ^ uVar22;
  uVar17 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar29 = uVar29 ^ uVar32;
  uVar23 = uVar23 + lVar15 + uVar17;
  uVar24 = uVar24 ^ uVar23;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar22 = uVar22 + uVar24;
  uVar17 = uVar17 ^ uVar22;
  uVar17 = uVar17 >> 0x3f | uVar17 << 1;
  uVar28 = uVar28 >> 0x20 | uVar28 << 0x20;
  uVar18 = uVar18 + uVar28;
  uVar20 = uVar20 ^ uVar18;
  uVar20 = uVar20 >> 0x18 | uVar20 << 0x28;
  uVar25 = uVar25 + lVar6 + uVar20;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x10 | uVar28 << 0x30;
  uVar18 = uVar18 + uVar28;
  uVar20 = uVar20 ^ uVar18;
  uVar20 = uVar20 >> 0x3f | uVar20 << 1;
  uVar29 = uVar29 >> 0x20 | uVar29 << 0x20;
  uVar19 = uVar19 + uVar29;
  uVar33 = uVar33 ^ uVar19;
  uVar31 = uVar33 >> 0x18 | uVar33 << 0x28;
  uVar32 = uVar32 + lVar5 + uVar31;
  uVar29 = uVar29 ^ uVar32;
  uVar29 = uVar29 >> 0x10 | uVar29 << 0x30;
  uVar19 = uVar19 + uVar29;
  uVar25 = uVar25 + lVar4 + uVar17;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x3f | uVar31 << 1;
  uVar29 = uVar29 ^ uVar25;
  uVar32 = uVar32 + lVar14 + uVar20;
  uVar30 = uVar30 + lVar10 + uVar21;
  uVar27 = uVar27 ^ uVar30;
  uVar27 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar26 = uVar26 + uVar27;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar30 = uVar30 + lVar3 + uVar21;
  uVar27 = uVar27 ^ uVar30;
  uVar27 = uVar27 >> 0x10 | uVar27 << 0x30;
  uVar26 = uVar26 + uVar27;
  uVar27 = uVar27 ^ uVar32;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar23 = uVar23 + lVar8 + uVar21;
  uVar28 = uVar28 ^ uVar23;
  uVar28 = uVar28 >> 0x20 | uVar28 << 0x20;
  uVar30 = uVar30 + lVar12 + uVar31;
  uVar19 = uVar19 + uVar28;
  uVar24 = uVar24 ^ uVar30;
  uVar21 = uVar21 ^ uVar19;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar23 = uVar23 + lVar10 + uVar21;
  uVar28 = uVar28 ^ uVar23;
  uVar28 = uVar28 >> 0x10 | uVar28 << 0x30;
  uVar19 = uVar19 + uVar28;
  uVar21 = uVar21 ^ uVar19;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar29 = uVar29 >> 0x20 | uVar29 << 0x20;
  uVar26 = uVar26 + uVar29;
  uVar17 = uVar17 ^ uVar26;
  uVar17 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar25 = uVar25 + lVar5 + uVar17;
  uVar29 = uVar29 ^ uVar25;
  uVar29 = uVar29 >> 0x10 | uVar29 << 0x30;
  uVar26 = uVar26 + uVar29;
  uVar17 = uVar17 ^ uVar26;
  uVar17 = uVar17 >> 0x3f | uVar17 << 1;
  uVar27 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar22 = uVar22 + uVar27;
  uVar23 = uVar23 + lVar2 + uVar17;
  uVar20 = uVar20 ^ uVar22;
  uVar20 = uVar20 >> 0x18 | uVar20 << 0x28;
  uVar32 = uVar32 + lVar13 + uVar20;
  uVar27 = uVar27 ^ uVar32;
  uVar27 = uVar27 >> 0x10 | uVar27 << 0x30;
  uVar22 = uVar22 + uVar27;
  uVar20 = uVar20 ^ uVar22;
  uVar20 = uVar20 >> 0x3f | uVar20 << 1;
  uVar24 = uVar24 >> 0x20 | uVar24 << 0x20;
  uVar18 = uVar18 + uVar24;
  uVar25 = uVar25 + lVar7 + uVar20;
  uVar31 = uVar31 ^ uVar18;
  uVar31 = uVar31 >> 0x18 | uVar31 << 0x28;
  uVar30 = uVar30 + lVar15 + uVar31;
  uVar28 = uVar28 ^ uVar25;
  uVar24 = uVar24 ^ uVar30;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar18 = uVar18 + uVar24;
  uVar24 = uVar24 ^ uVar23;
  uVar31 = uVar31 ^ uVar18;
  uVar31 = uVar31 >> 0x3f | uVar31 << 1;
  uVar24 = uVar24 >> 0x20 | uVar24 << 0x20;
  uVar22 = uVar22 + uVar24;
  uVar17 = uVar17 ^ uVar22;
  uVar17 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar32 = uVar32 + lVar3 + uVar31;
  uVar29 = uVar29 ^ uVar32;
  uVar23 = uVar23 + lVar6 + uVar17;
  uVar24 = uVar24 ^ uVar23;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar22 = uVar22 + uVar24;
  uVar17 = uVar17 ^ uVar22;
  uVar17 = uVar17 >> 0x3f | uVar17 << 1;
  uVar28 = uVar28 >> 0x20 | uVar28 << 0x20;
  uVar18 = uVar18 + uVar28;
  uVar20 = uVar20 ^ uVar18;
  uVar20 = uVar20 >> 0x18 | uVar20 << 0x28;
  uVar25 = uVar25 + lVar11 + uVar20;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x10 | uVar28 << 0x30;
  uVar18 = uVar18 + uVar28;
  uVar20 = uVar20 ^ uVar18;
  uVar20 = uVar20 >> 0x3f | uVar20 << 1;
  uVar29 = uVar29 >> 0x20 | uVar29 << 0x20;
  uVar19 = uVar19 + uVar29;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x18 | uVar31 << 0x28;
  uVar32 = uVar32 + lVar1 + uVar31;
  uVar29 = uVar29 ^ uVar32;
  uVar29 = uVar29 >> 0x10 | uVar29 << 0x30;
  uVar19 = uVar19 + uVar29;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x3f | uVar31 << 1;
  uVar25 = uVar25 + lVar7 + uVar17;
  uVar30 = uVar30 + lVar16 + uVar21;
  uVar29 = uVar29 ^ uVar25;
  uVar27 = uVar27 ^ uVar30;
  uVar27 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar26 = uVar26 + uVar27;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar32 = uVar32 + lVar2 + uVar20;
  uVar30 = uVar30 + lVar9 + uVar21;
  uVar27 = uVar27 ^ uVar30;
  uVar27 = uVar27 >> 0x10 | uVar27 << 0x30;
  uVar26 = uVar26 + uVar27;
  uVar27 = uVar27 ^ uVar32;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar23 = uVar23 + lVar10 + uVar21;
  uVar28 = uVar28 ^ uVar23;
  uVar28 = uVar28 >> 0x20 | uVar28 << 0x20;
  uVar19 = uVar19 + uVar28;
  uVar21 = uVar21 ^ uVar19;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar30 = uVar30 + lVar11 + uVar31;
  uVar24 = uVar24 ^ uVar30;
  uVar23 = uVar23 + lVar1 + uVar21;
  uVar28 = uVar28 ^ uVar23;
  uVar28 = uVar28 >> 0x10 | uVar28 << 0x30;
  uVar19 = uVar19 + uVar28;
  uVar21 = uVar21 ^ uVar19;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar29 = uVar29 >> 0x20 | uVar29 << 0x20;
  uVar26 = uVar26 + uVar29;
  uVar17 = uVar17 ^ uVar26;
  uVar17 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar25 = uVar25 + lVar8 + uVar17;
  uVar29 = uVar29 ^ uVar25;
  uVar29 = uVar29 >> 0x10 | uVar29 << 0x30;
  uVar26 = uVar26 + uVar29;
  uVar17 = uVar17 ^ uVar26;
  uVar17 = uVar17 >> 0x3f | uVar17 << 1;
  uVar27 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar22 = uVar22 + uVar27;
  uVar23 = uVar23 + lVar15 + uVar17;
  uVar20 = uVar20 ^ uVar22;
  uVar20 = uVar20 >> 0x18 | uVar20 << 0x28;
  uVar32 = uVar32 + lVar3 + uVar20;
  uVar27 = uVar27 ^ uVar32;
  uVar27 = uVar27 >> 0x10 | uVar27 << 0x30;
  uVar22 = uVar22 + uVar27;
  uVar20 = uVar20 ^ uVar22;
  uVar20 = uVar20 >> 0x3f | uVar20 << 1;
  uVar24 = uVar24 >> 0x20 | uVar24 << 0x20;
  uVar25 = uVar25 + lVar12 + uVar20;
  uVar18 = uVar18 + uVar24;
  uVar28 = uVar28 ^ uVar25;
  uVar31 = uVar31 ^ uVar18;
  uVar31 = uVar31 >> 0x18 | uVar31 << 0x28;
  uVar30 = uVar30 + lVar16 + uVar31;
  uVar24 = uVar24 ^ uVar30;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar18 = uVar18 + uVar24;
  uVar24 = uVar24 ^ uVar23;
  uVar31 = uVar31 ^ uVar18;
  uVar31 = uVar31 >> 0x3f | uVar31 << 1;
  uVar24 = uVar24 >> 0x20 | uVar24 << 0x20;
  uVar22 = uVar22 + uVar24;
  uVar32 = uVar32 + lVar6 + uVar31;
  uVar17 = uVar17 ^ uVar22;
  uVar17 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar29 = uVar29 ^ uVar32;
  uVar23 = uVar23 + lVar5 + uVar17;
  uVar24 = uVar24 ^ uVar23;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar22 = uVar22 + uVar24;
  uVar17 = uVar17 ^ uVar22;
  uVar17 = uVar17 >> 0x3f | uVar17 << 1;
  uVar28 = uVar28 >> 0x20 | uVar28 << 0x20;
  uVar18 = uVar18 + uVar28;
  uVar20 = uVar20 ^ uVar18;
  uVar20 = uVar20 >> 0x18 | uVar20 << 0x28;
  uVar25 = uVar25 + lVar13 + uVar20;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x10 | uVar28 << 0x30;
  uVar18 = uVar18 + uVar28;
  uVar20 = uVar20 ^ uVar18;
  uVar20 = uVar20 >> 0x3f | uVar20 << 1;
  uVar29 = uVar29 >> 0x20 | uVar29 << 0x20;
  uVar19 = uVar19 + uVar29;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x18 | uVar31 << 0x28;
  uVar32 = uVar32 + lVar9 + uVar31;
  uVar29 = uVar29 ^ uVar32;
  uVar29 = uVar29 >> 0x10 | uVar29 << 0x30;
  uVar19 = uVar19 + uVar29;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x3f | uVar31 << 1;
  uVar25 = uVar25 + lVar6 + uVar17;
  uVar29 = uVar29 ^ uVar25;
  uVar32 = uVar32 + lVar1 + uVar20;
  uVar30 = uVar30 + lVar4 + uVar21;
  uVar27 = uVar27 ^ uVar30;
  uVar27 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar26 = uVar26 + uVar27;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar30 = uVar30 + lVar14 + uVar21;
  uVar27 = uVar27 ^ uVar30;
  uVar27 = uVar27 >> 0x10 | uVar27 << 0x30;
  uVar26 = uVar26 + uVar27;
  uVar27 = uVar27 ^ uVar32;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar23 = uVar23 + lVar2 + uVar21;
  uVar28 = uVar28 ^ uVar23;
  uVar28 = uVar28 >> 0x20 | uVar28 << 0x20;
  uVar19 = uVar19 + uVar28;
  uVar30 = uVar30 + lVar9 + uVar31;
  uVar21 = uVar21 ^ uVar19;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar23 = uVar23 + lVar13 + uVar21;
  uVar24 = uVar24 ^ uVar30;
  uVar28 = uVar28 ^ uVar23;
  uVar28 = uVar28 >> 0x10 | uVar28 << 0x30;
  uVar19 = uVar19 + uVar28;
  uVar21 = uVar21 ^ uVar19;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar29 = uVar29 >> 0x20 | uVar29 << 0x20;
  uVar26 = uVar26 + uVar29;
  uVar17 = uVar17 ^ uVar26;
  uVar17 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar25 = uVar25 + lVar11 + uVar17;
  uVar29 = uVar29 ^ uVar25;
  uVar29 = uVar29 >> 0x10 | uVar29 << 0x30;
  uVar26 = uVar26 + uVar29;
  uVar17 = uVar17 ^ uVar26;
  uVar17 = uVar17 >> 0x3f | uVar17 << 1;
  uVar27 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar23 = uVar23 + lVar3 + uVar17;
  uVar22 = uVar22 + uVar27;
  uVar20 = uVar20 ^ uVar22;
  uVar20 = uVar20 >> 0x18 | uVar20 << 0x28;
  uVar32 = uVar32 + lVar12 + uVar20;
  uVar27 = uVar27 ^ uVar32;
  uVar27 = uVar27 >> 0x10 | uVar27 << 0x30;
  uVar22 = uVar22 + uVar27;
  uVar20 = uVar20 ^ uVar22;
  uVar20 = uVar20 >> 0x3f | uVar20 << 1;
  uVar24 = uVar24 >> 0x20 | uVar24 << 0x20;
  uVar25 = uVar25 + lVar8 + uVar20;
  uVar28 = uVar28 ^ uVar25;
  uVar18 = uVar18 + uVar24;
  uVar31 = uVar31 ^ uVar18;
  uVar31 = uVar31 >> 0x18 | uVar31 << 0x28;
  uVar30 = uVar30 + lVar4 + uVar31;
  uVar24 = uVar24 ^ uVar30;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar18 = uVar18 + uVar24;
  uVar24 = uVar24 ^ uVar23;
  uVar31 = uVar31 ^ uVar18;
  uVar31 = uVar31 >> 0x3f | uVar31 << 1;
  uVar24 = uVar24 >> 0x20 | uVar24 << 0x20;
  uVar22 = uVar22 + uVar24;
  uVar32 = uVar32 + lVar16 + uVar31;
  uVar17 = uVar17 ^ uVar22;
  uVar17 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar29 = uVar29 ^ uVar32;
  uVar23 = uVar23 + lVar14 + uVar17;
  uVar30 = uVar30 + lVar5 + uVar21;
  uVar24 = uVar24 ^ uVar23;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar22 = uVar22 + uVar24;
  uVar27 = uVar27 ^ uVar30;
  uVar17 = uVar17 ^ uVar22;
  uVar17 = uVar17 >> 0x3f | uVar17 << 1;
  uVar28 = uVar28 >> 0x20 | uVar28 << 0x20;
  uVar18 = uVar18 + uVar28;
  uVar20 = uVar20 ^ uVar18;
  uVar20 = uVar20 >> 0x18 | uVar20 << 0x28;
  uVar25 = uVar25 + lVar7 + uVar20;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x10 | uVar28 << 0x30;
  uVar18 = uVar18 + uVar28;
  uVar20 = uVar20 ^ uVar18;
  uVar20 = uVar20 >> 0x3f | uVar20 << 1;
  uVar29 = uVar29 >> 0x20 | uVar29 << 0x20;
  uVar25 = uVar25 + lVar5 + uVar17;
  uVar19 = uVar19 + uVar29;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x18 | uVar31 << 0x28;
  uVar32 = uVar32 + lVar15 + uVar31;
  uVar29 = uVar29 ^ uVar32;
  uVar29 = uVar29 >> 0x10 | uVar29 << 0x30;
  uVar19 = uVar19 + uVar29;
  uVar29 = uVar29 ^ uVar25;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x3f | uVar31 << 1;
  uVar27 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar26 = uVar26 + uVar27;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar30 = uVar30 + lVar10 + uVar21;
  uVar27 = uVar27 ^ uVar30;
  uVar27 = uVar27 >> 0x10 | uVar27 << 0x30;
  uVar26 = uVar26 + uVar27;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar23 = uVar23 + lVar13 + uVar21;
  uVar28 = uVar28 ^ uVar23;
  uVar28 = uVar28 >> 0x20 | uVar28 << 0x20;
  uVar19 = uVar19 + uVar28;
  uVar32 = uVar32 + lVar15 + uVar20;
  uVar21 = uVar21 ^ uVar19;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar27 = uVar27 ^ uVar32;
  uVar30 = uVar30 + lVar3 + uVar31;
  uVar24 = uVar24 ^ uVar30;
  uVar23 = uVar23 + lVar7 + uVar21;
  uVar28 = uVar28 ^ uVar23;
  uVar28 = uVar28 >> 0x10 | uVar28 << 0x30;
  uVar19 = uVar19 + uVar28;
  uVar21 = uVar21 ^ uVar19;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar29 = uVar29 >> 0x20 | uVar29 << 0x20;
  uVar26 = uVar26 + uVar29;
  uVar17 = uVar17 ^ uVar26;
  uVar17 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar25 = uVar25 + lVar16 + uVar17;
  uVar29 = uVar29 ^ uVar25;
  uVar29 = uVar29 >> 0x10 | uVar29 << 0x30;
  uVar26 = uVar26 + uVar29;
  uVar17 = uVar17 ^ uVar26;
  uVar17 = uVar17 >> 0x3f | uVar17 << 1;
  uVar27 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar23 = uVar23 + lVar1 + uVar17;
  uVar22 = uVar22 + uVar27;
  uVar20 = uVar20 ^ uVar22;
  uVar20 = uVar20 >> 0x18 | uVar20 << 0x28;
  uVar32 = uVar32 + lVar14 + uVar20;
  uVar27 = uVar27 ^ uVar32;
  uVar27 = uVar27 >> 0x10 | uVar27 << 0x30;
  uVar22 = uVar22 + uVar27;
  uVar20 = uVar20 ^ uVar22;
  uVar20 = uVar20 >> 0x3f | uVar20 << 1;
  uVar24 = uVar24 >> 0x20 | uVar24 << 0x20;
  uVar18 = uVar18 + uVar24;
  uVar25 = uVar25 + lVar6 + uVar20;
  uVar31 = uVar31 ^ uVar18;
  uVar31 = uVar31 >> 0x18 | uVar31 << 0x28;
  uVar30 = uVar30 + lVar11 + uVar31;
  uVar28 = uVar28 ^ uVar25;
  uVar24 = uVar24 ^ uVar30;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar18 = uVar18 + uVar24;
  uVar24 = uVar24 ^ uVar23;
  uVar31 = uVar31 ^ uVar18;
  uVar31 = uVar31 >> 0x3f | uVar31 << 1;
  uVar24 = uVar24 >> 0x20 | uVar24 << 0x20;
  uVar22 = uVar22 + uVar24;
  uVar17 = uVar17 ^ uVar22;
  uVar17 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar32 = uVar32 + lVar10 + uVar31;
  uVar29 = uVar29 ^ uVar32;
  uVar23 = uVar23 + lVar8 + uVar17;
  uVar30 = uVar30 + lVar9 + uVar21;
  uVar24 = uVar24 ^ uVar23;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar22 = uVar22 + uVar24;
  uVar27 = uVar27 ^ uVar30;
  uVar17 = uVar17 ^ uVar22;
  uVar17 = uVar17 >> 0x3f | uVar17 << 1;
  uVar28 = uVar28 >> 0x20 | uVar28 << 0x20;
  uVar18 = uVar18 + uVar28;
  uVar20 = uVar20 ^ uVar18;
  uVar20 = uVar20 >> 0x18 | uVar20 << 0x28;
  uVar25 = uVar25 + lVar4 + uVar20;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x10 | uVar28 << 0x30;
  uVar18 = uVar18 + uVar28;
  uVar20 = uVar20 ^ uVar18;
  uVar20 = uVar20 >> 0x3f | uVar20 << 1;
  uVar29 = uVar29 >> 0x20 | uVar29 << 0x20;
  uVar25 = uVar25 + lVar8 + uVar17;
  uVar19 = uVar19 + uVar29;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x18 | uVar31 << 0x28;
  uVar32 = uVar32 + lVar2 + uVar31;
  uVar29 = uVar29 ^ uVar32;
  uVar29 = uVar29 >> 0x10 | uVar29 << 0x30;
  uVar19 = uVar19 + uVar29;
  uVar29 = uVar29 ^ uVar25;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x3f | uVar31 << 1;
  uVar27 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar32 = uVar32 + lVar13 + uVar20;
  uVar26 = uVar26 + uVar27;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar30 = uVar30 + lVar12 + uVar21;
  uVar27 = uVar27 ^ uVar30;
  uVar27 = uVar27 >> 0x10 | uVar27 << 0x30;
  uVar26 = uVar26 + uVar27;
  uVar27 = uVar27 ^ uVar32;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar23 = uVar23 + lVar14 + uVar21;
  uVar28 = uVar28 ^ uVar23;
  uVar28 = uVar28 >> 0x20 | uVar28 << 0x20;
  uVar30 = uVar30 + lVar4 + uVar31;
  uVar24 = uVar24 ^ uVar30;
  uVar19 = uVar19 + uVar28;
  uVar21 = uVar21 ^ uVar19;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar23 = uVar23 + lVar12 + uVar21;
  uVar28 = uVar28 ^ uVar23;
  uVar28 = uVar28 >> 0x10 | uVar28 << 0x30;
  uVar19 = uVar19 + uVar28;
  uVar21 = uVar21 ^ uVar19;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar29 = uVar29 >> 0x20 | uVar29 << 0x20;
  uVar26 = uVar26 + uVar29;
  uVar17 = uVar17 ^ uVar26;
  uVar17 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar25 = uVar25 + lVar15 + uVar17;
  uVar29 = uVar29 ^ uVar25;
  uVar29 = uVar29 >> 0x10 | uVar29 << 0x30;
  uVar26 = uVar26 + uVar29;
  uVar17 = uVar17 ^ uVar26;
  uVar17 = uVar17 >> 0x3f | uVar17 << 1;
  uVar27 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar23 = uVar23 + lVar7 + uVar17;
  uVar22 = uVar22 + uVar27;
  uVar20 = uVar20 ^ uVar22;
  uVar20 = uVar20 >> 0x18 | uVar20 << 0x28;
  uVar32 = uVar32 + lVar5 + uVar20;
  uVar27 = uVar27 ^ uVar32;
  uVar27 = uVar27 >> 0x10 | uVar27 << 0x30;
  uVar22 = uVar22 + uVar27;
  uVar20 = uVar20 ^ uVar22;
  uVar20 = uVar20 >> 0x3f | uVar20 << 1;
  uVar24 = uVar24 >> 0x20 | uVar24 << 0x20;
  uVar25 = uVar25 + lVar16 + uVar20;
  uVar28 = uVar28 ^ uVar25;
  uVar18 = uVar18 + uVar24;
  uVar31 = uVar31 ^ uVar18;
  uVar31 = uVar31 >> 0x18 | uVar31 << 0x28;
  uVar30 = uVar30 + lVar10 + uVar31;
  uVar24 = uVar24 ^ uVar30;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar18 = uVar18 + uVar24;
  uVar24 = uVar24 ^ uVar23;
  uVar31 = uVar31 ^ uVar18;
  uVar31 = uVar31 >> 0x3f | uVar31 << 1;
  uVar24 = uVar24 >> 0x20 | uVar24 << 0x20;
  uVar22 = uVar22 + uVar24;
  uVar32 = uVar32 + lVar9 + uVar31;
  uVar17 = uVar17 ^ uVar22;
  uVar17 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar29 = uVar29 ^ uVar32;
  uVar23 = uVar23 + lVar1 + uVar17;
  uVar30 = uVar30 + lVar2 + uVar21;
  uVar24 = uVar24 ^ uVar23;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar22 = uVar22 + uVar24;
  uVar27 = uVar27 ^ uVar30;
  uVar17 = uVar17 ^ uVar22;
  uVar17 = uVar17 >> 0x3f | uVar17 << 1;
  uVar28 = uVar28 >> 0x20 | uVar28 << 0x20;
  uVar18 = uVar18 + uVar28;
  uVar20 = uVar20 ^ uVar18;
  uVar20 = uVar20 >> 0x18 | uVar20 << 0x28;
  uVar25 = uVar25 + lVar3 + uVar20;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x10 | uVar28 << 0x30;
  uVar18 = uVar18 + uVar28;
  uVar20 = uVar20 ^ uVar18;
  uVar20 = uVar20 >> 0x3f | uVar20 << 1;
  uVar29 = uVar29 >> 0x20 | uVar29 << 0x20;
  uVar25 = uVar25 + lVar15 + uVar17;
  uVar19 = uVar19 + uVar29;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x18 | uVar31 << 0x28;
  uVar32 = uVar32 + lVar6 + uVar31;
  uVar29 = uVar29 ^ uVar32;
  uVar29 = uVar29 >> 0x10 | uVar29 << 0x30;
  uVar19 = uVar19 + uVar29;
  uVar29 = uVar29 ^ uVar25;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x3f | uVar31 << 1;
  uVar27 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar26 = uVar26 + uVar27;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar30 = uVar30 + lVar11 + uVar21;
  uVar27 = uVar27 ^ uVar30;
  uVar27 = uVar27 >> 0x10 | uVar27 << 0x30;
  uVar26 = uVar26 + uVar27;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar23 = uVar23 + lVar6 + uVar21;
  uVar28 = uVar28 ^ uVar23;
  uVar28 = uVar28 >> 0x20 | uVar28 << 0x20;
  uVar19 = uVar19 + uVar28;
  uVar32 = uVar32 + lVar12 + uVar20;
  uVar21 = uVar21 ^ uVar19;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar27 = uVar27 ^ uVar32;
  uVar30 = uVar30 + lVar1 + uVar31;
  uVar24 = uVar24 ^ uVar30;
  uVar23 = uVar23 + lVar16 + uVar21;
  uVar28 = uVar28 ^ uVar23;
  uVar28 = uVar28 >> 0x10 | uVar28 << 0x30;
  uVar19 = uVar19 + uVar28;
  uVar21 = uVar21 ^ uVar19;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar29 = uVar29 >> 0x20 | uVar29 << 0x20;
  uVar26 = uVar26 + uVar29;
  uVar17 = uVar17 ^ uVar26;
  uVar17 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar25 = uVar25 + lVar10 + uVar17;
  uVar29 = uVar29 ^ uVar25;
  uVar29 = uVar29 >> 0x10 | uVar29 << 0x30;
  uVar26 = uVar26 + uVar29;
  uVar17 = uVar17 ^ uVar26;
  uVar17 = uVar17 >> 0x3f | uVar17 << 1;
  uVar27 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar23 = uVar23 + lVar13 + uVar17;
  uVar22 = uVar22 + uVar27;
  uVar20 = uVar20 ^ uVar22;
  uVar20 = uVar20 >> 0x18 | uVar20 << 0x28;
  uVar32 = uVar32 + lVar4 + uVar20;
  uVar27 = uVar27 ^ uVar32;
  uVar27 = uVar27 >> 0x10 | uVar27 << 0x30;
  uVar22 = uVar22 + uVar27;
  uVar20 = uVar20 ^ uVar22;
  uVar20 = uVar20 >> 0x3f | uVar20 << 1;
  uVar24 = uVar24 >> 0x20 | uVar24 << 0x20;
  uVar25 = uVar25 + lVar14 + uVar20;
  uVar28 = uVar28 ^ uVar25;
  uVar18 = uVar18 + uVar24;
  uVar31 = uVar31 ^ uVar18;
  uVar31 = uVar31 >> 0x18 | uVar31 << 0x28;
  uVar30 = uVar30 + lVar9 + uVar31;
  uVar24 = uVar24 ^ uVar30;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar18 = uVar18 + uVar24;
  uVar24 = uVar24 ^ uVar23;
  uVar31 = uVar31 ^ uVar18;
  uVar31 = uVar31 >> 0x3f | uVar31 << 1;
  uVar24 = uVar24 >> 0x20 | uVar24 << 0x20;
  uVar22 = uVar22 + uVar24;
  uVar32 = uVar32 + lVar5 + uVar31;
  uVar17 = uVar17 ^ uVar22;
  uVar17 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar29 = uVar29 ^ uVar32;
  uVar23 = uVar23 + lVar2 + uVar17;
  uVar24 = uVar24 ^ uVar23;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar22 = uVar22 + uVar24;
  uVar17 = uVar17 ^ uVar22;
  uVar17 = uVar17 >> 0x3f | uVar17 << 1;
  uVar28 = uVar28 >> 0x20 | uVar28 << 0x20;
  uVar18 = uVar18 + uVar28;
  uVar20 = uVar20 ^ uVar18;
  uVar20 = uVar20 >> 0x18 | uVar20 << 0x28;
  uVar25 = uVar25 + lVar8 + uVar20;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x10 | uVar28 << 0x30;
  uVar18 = uVar18 + uVar28;
  uVar20 = uVar20 ^ uVar18;
  uVar20 = uVar20 >> 0x3f | uVar20 << 1;
  uVar29 = uVar29 >> 0x20 | uVar29 << 0x20;
  uVar25 = uVar25 + lVar9 + uVar17;
  uVar19 = uVar19 + uVar29;
  uVar31 = uVar31 ^ uVar19;
  uVar31 = uVar31 >> 0x18 | uVar31 << 0x28;
  uVar32 = uVar32 + lVar3 + uVar31;
  uVar30 = uVar30 + lVar11 + uVar21;
  uVar29 = uVar29 ^ uVar32;
  uVar29 = uVar29 >> 0x10 | uVar29 << 0x30;
  uVar19 = uVar19 + uVar29;
  uVar27 = uVar27 ^ uVar30;
  uVar29 = uVar29 ^ uVar25;
  uVar31 = uVar31 ^ uVar19;
  uVar33 = uVar31 >> 0x3f | uVar31 << 1;
  uVar27 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar31 = uVar32 + lVar8 + uVar20;
  uVar26 = uVar26 + uVar27;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar30 = uVar30 + lVar7 + uVar21;
  uVar27 = uVar27 ^ uVar30;
  uVar27 = uVar27 >> 0x10 | uVar27 << 0x30;
  uVar26 = uVar26 + uVar27;
  uVar27 = uVar27 ^ uVar31;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar23 = uVar23 + lVar11 + uVar21;
  uVar28 = uVar28 ^ uVar23;
  uVar28 = uVar28 >> 0x20 | uVar28 << 0x20;
  uVar32 = uVar30 + lVar5 + uVar33;
  uVar24 = uVar24 ^ uVar32;
  uVar19 = uVar19 + uVar28;
  uVar21 = uVar21 ^ uVar19;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar23 = uVar23 + lVar2 + uVar21;
  uVar28 = uVar28 ^ uVar23;
  uVar28 = uVar28 >> 0x10 | uVar28 << 0x30;
  uVar19 = uVar19 + uVar28;
  uVar21 = uVar21 ^ uVar19;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar29 = uVar29 >> 0x20 | uVar29 << 0x20;
  uVar26 = uVar26 + uVar29;
  uVar17 = uVar17 ^ uVar26;
  uVar17 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar25 = uVar25 + lVar3 + uVar17;
  uVar29 = uVar29 ^ uVar25;
  uVar29 = uVar29 >> 0x10 | uVar29 << 0x30;
  uVar26 = uVar26 + uVar29;
  uVar17 = uVar17 ^ uVar26;
  uVar17 = uVar17 >> 0x3f | uVar17 << 1;
  uVar27 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar23 = uVar23 + lVar16 + uVar17;
  uVar22 = uVar22 + uVar27;
  uVar20 = uVar20 ^ uVar22;
  uVar20 = uVar20 >> 0x18 | uVar20 << 0x28;
  uVar31 = uVar31 + lVar6 + uVar20;
  uVar27 = uVar27 ^ uVar31;
  uVar30 = uVar27 >> 0x10 | uVar27 << 0x30;
  uVar22 = uVar22 + uVar30;
  uVar20 = uVar20 ^ uVar22;
  uVar20 = uVar20 >> 0x3f | uVar20 << 1;
  uVar24 = uVar24 >> 0x20 | uVar24 << 0x20;
  uVar18 = uVar18 + uVar24;
  uVar25 = uVar25 + lVar10 + uVar20;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 >> 0x18 | uVar33 << 0x28;
  uVar27 = uVar32 + lVar7 + uVar33;
  uVar28 = uVar28 ^ uVar25;
  uVar24 = uVar24 ^ uVar27;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar18 = uVar18 + uVar24;
  uVar24 = uVar24 ^ uVar23;
  uVar33 = uVar33 ^ uVar18;
  uVar33 = uVar33 >> 0x3f | uVar33 << 1;
  uVar24 = uVar24 >> 0x20 | uVar24 << 0x20;
  uVar31 = uVar31 + lVar4 + uVar33;
  uVar29 = uVar29 ^ uVar31;
  uVar22 = uVar22 + uVar24;
  uVar17 = uVar17 ^ uVar22;
  uVar17 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar23 = uVar23 + lVar12 + uVar17;
  uVar32 = uVar27 + lVar14 + uVar21;
  uVar24 = uVar24 ^ uVar23;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar22 = uVar22 + uVar24;
  uVar30 = uVar30 ^ uVar32;
  uVar17 = uVar17 ^ uVar22;
  uVar17 = uVar17 >> 0x3f | uVar17 << 1;
  uVar28 = uVar28 >> 0x20 | uVar28 << 0x20;
  uVar18 = uVar18 + uVar28;
  uVar20 = uVar20 ^ uVar18;
  uVar20 = uVar20 >> 0x18 | uVar20 << 0x28;
  uVar25 = uVar25 + lVar15 + uVar20;
  uVar28 = uVar28 ^ uVar25;
  uVar28 = uVar28 >> 0x10 | uVar28 << 0x30;
  uVar18 = uVar18 + uVar28;
  uVar20 = uVar20 ^ uVar18;
  uVar20 = uVar20 >> 0x3f | uVar20 << 1;
  uVar29 = uVar29 >> 0x20 | uVar29 << 0x20;
  uVar19 = uVar19 + uVar29;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 >> 0x18 | uVar33 << 0x28;
  uVar31 = uVar31 + lVar13 + uVar33;
  uVar29 = uVar29 ^ uVar31;
  uVar27 = uVar29 >> 0x10 | uVar29 << 0x30;
  uVar19 = uVar19 + uVar27;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 >> 0x3f | uVar33 << 1;
  uVar30 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar29 = uVar25 + lVar2 + uVar17;
  uVar27 = uVar27 ^ uVar29;
  uVar26 = uVar26 + uVar30;
  uVar31 = uVar31 + lVar3 + uVar20;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar25 = uVar32 + lVar1 + uVar21;
  uVar30 = uVar30 ^ uVar25;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x30;
  uVar26 = uVar26 + uVar30;
  uVar30 = uVar30 ^ uVar31;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar23 = uVar23 + lVar1 + uVar21;
  uVar28 = uVar28 ^ uVar23;
  uVar28 = uVar28 >> 0x20 | uVar28 << 0x20;
  uVar19 = uVar19 + uVar28;
  uVar21 = uVar21 ^ uVar19;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar32 = uVar25 + lVar6 + uVar33;
  uVar24 = uVar24 ^ uVar32;
  uVar25 = uVar23 + lVar5 + uVar21;
  uVar28 = uVar28 ^ uVar25;
  uVar23 = uVar28 >> 0x10 | uVar28 << 0x30;
  uVar19 = uVar19 + uVar23;
  uVar21 = uVar21 ^ uVar19;
  uVar21 = uVar21 >> 0x3f | uVar21 << 1;
  uVar28 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar26 = uVar26 + uVar28;
  uVar17 = uVar17 ^ uVar26;
  uVar17 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar29 = uVar29 + lVar4 + uVar17;
  uVar28 = uVar28 ^ uVar29;
  uVar27 = uVar28 >> 0x10 | uVar28 << 0x30;
  uVar26 = uVar26 + uVar27;
  uVar17 = uVar17 ^ uVar26;
  uVar17 = uVar17 >> 0x3f | uVar17 << 1;
  uVar30 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar22 = uVar22 + uVar30;
  uVar28 = uVar25 + lVar9 + uVar17;
  uVar20 = uVar20 ^ uVar22;
  uVar20 = uVar20 >> 0x18 | uVar20 << 0x28;
  uVar25 = uVar31 + lVar7 + uVar20;
  uVar30 = uVar30 ^ uVar25;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x30;
  uVar22 = uVar22 + uVar30;
  uVar20 = uVar20 ^ uVar22;
  uVar20 = uVar20 >> 0x3f | uVar20 << 1;
  uVar24 = uVar24 >> 0x20 | uVar24 << 0x20;
  uVar29 = uVar29 + lVar11 + uVar20;
  uVar18 = uVar18 + uVar24;
  uVar23 = uVar23 ^ uVar29;
  uVar33 = uVar33 ^ uVar18;
  uVar31 = uVar33 >> 0x18 | uVar33 << 0x28;
  uVar32 = uVar32 + lVar8 + uVar31;
  uVar24 = uVar24 ^ uVar32;
  uVar24 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar18 = uVar18 + uVar24;
  uVar24 = uVar24 ^ uVar28;
  uVar31 = uVar31 ^ uVar18;
  uVar33 = uVar31 >> 0x3f | uVar31 << 1;
  uVar24 = uVar24 >> 0x20 | uVar24 << 0x20;
  uVar22 = uVar22 + uVar24;
  uVar31 = uVar25 + lVar13 + uVar33;
  uVar17 = uVar17 ^ uVar22;
  uVar17 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar27 = uVar27 ^ uVar31;
  uVar25 = uVar28 + lVar10 + uVar17;
  uVar24 = uVar24 ^ uVar25;
  uVar28 = uVar24 >> 0x10 | uVar24 << 0x30;
  uVar22 = uVar22 + uVar28;
  uVar17 = uVar17 ^ uVar22;
  uVar17 = uVar17 >> 0x3f | uVar17 << 1;
  uVar23 = uVar23 >> 0x20 | uVar23 << 0x20;
  uVar18 = uVar18 + uVar23;
  uVar32 = uVar32 + lVar15 + uVar21;
  uVar20 = uVar20 ^ uVar18;
  uVar24 = uVar20 >> 0x18 | uVar20 << 0x28;
  uVar29 = uVar29 + lVar12 + uVar24;
  uVar30 = uVar30 ^ uVar32;
  uVar23 = uVar23 ^ uVar29;
  uVar20 = uVar23 >> 0x10 | uVar23 << 0x30;
  uVar18 = uVar18 + uVar20;
  uVar24 = uVar24 ^ uVar18;
  uVar24 = uVar24 >> 0x3f | uVar24 << 1;
  uVar23 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar29 = uVar29 + lVar3 + uVar17;
  uVar19 = uVar19 + uVar23;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 >> 0x18 | uVar33 << 0x28;
  uVar31 = uVar31 + lVar14 + uVar33;
  uVar23 = uVar23 ^ uVar31;
  uVar27 = uVar23 >> 0x10 | uVar23 << 0x30;
  uVar19 = uVar19 + uVar27;
  uVar27 = uVar27 ^ uVar29;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 >> 0x3f | uVar33 << 1;
  uVar23 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar31 = uVar31 + lVar10 + uVar24;
  uVar26 = uVar26 + uVar23;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar32 = uVar32 + lVar16 + uVar21;
  uVar23 = uVar23 ^ uVar32;
  uVar30 = uVar23 >> 0x10 | uVar23 << 0x30;
  uVar26 = uVar26 + uVar30;
  uVar30 = uVar30 ^ uVar31;
  uVar21 = uVar21 ^ uVar26;
  uVar23 = uVar21 >> 0x3f | uVar21 << 1;
  uVar25 = uVar25 + lVar15 + uVar23;
  uVar20 = uVar20 ^ uVar25;
  uVar21 = uVar20 >> 0x20 | uVar20 << 0x20;
  uVar19 = uVar19 + uVar21;
  uVar32 = uVar32 + lVar14 + uVar33;
  uVar23 = uVar23 ^ uVar19;
  uVar23 = uVar23 >> 0x18 | uVar23 << 0x28;
  uVar28 = uVar28 ^ uVar32;
  uVar25 = uVar25 + lVar11 + uVar23;
  uVar21 = uVar21 ^ uVar25;
  uVar20 = uVar21 >> 0x10 | uVar21 << 0x30;
  uVar19 = uVar19 + uVar20;
  uVar23 = uVar23 ^ uVar19;
  uVar21 = uVar23 >> 0x3f | uVar23 << 1;
  uVar23 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar26 = uVar26 + uVar23;
  uVar17 = uVar17 ^ uVar26;
  uVar17 = uVar17 >> 0x18 | uVar17 << 0x28;
  uVar29 = uVar29 + lVar9 + uVar17;
  uVar23 = uVar23 ^ uVar29;
  uVar27 = uVar23 >> 0x10 | uVar23 << 0x30;
  uVar26 = uVar26 + uVar27;
  uVar17 = uVar17 ^ uVar26;
  uVar23 = uVar17 >> 0x3f | uVar17 << 1;
  uVar30 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar22 = uVar22 + uVar30;
  uVar25 = uVar25 + lVar5 + uVar23;
  uVar24 = uVar24 ^ uVar22;
  uVar17 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar31 = uVar31 + lVar16 + uVar17;
  uVar30 = uVar30 ^ uVar31;
  uVar30 = uVar30 >> 0x10 | uVar30 << 0x30;
  uVar22 = uVar22 + uVar30;
  uVar17 = uVar17 ^ uVar22;
  uVar24 = uVar17 >> 0x3f | uVar17 << 1;
  uVar17 = uVar28 >> 0x20 | uVar28 << 0x20;
  uVar18 = uVar18 + uVar17;
  uVar33 = uVar33 ^ uVar18;
  uVar28 = uVar33 >> 0x18 | uVar33 << 0x28;
  uVar32 = uVar32 + lVar6 + uVar28;
  uVar29 = uVar29 + lVar1 + uVar24;
  uVar17 = uVar17 ^ uVar32;
  uVar17 = uVar17 >> 0x10 | uVar17 << 0x30;
  uVar18 = uVar18 + uVar17;
  uVar17 = uVar17 ^ uVar25;
  uVar20 = uVar20 ^ uVar29;
  uVar28 = uVar28 ^ uVar18;
  uVar33 = uVar28 >> 0x3f | uVar28 << 1;
  uVar17 = uVar17 >> 0x20 | uVar17 << 0x20;
  uVar22 = uVar22 + uVar17;
  uVar23 = uVar23 ^ uVar22;
  uVar23 = uVar23 >> 0x18 | uVar23 << 0x28;
  uVar31 = uVar31 + lVar12 + uVar33;
  uVar27 = uVar27 ^ uVar31;
  uVar25 = uVar25 + lVar13 + uVar23;
  uVar17 = uVar17 ^ uVar25;
  uVar28 = uVar17 >> 0x10 | uVar17 << 0x30;
  uVar22 = uVar22 + uVar28;
  uVar32 = uVar32 + lVar7 + uVar21;
  uVar23 = uVar23 ^ uVar22;
  uVar17 = uVar20 >> 0x20 | uVar20 << 0x20;
  uVar30 = uVar30 ^ uVar32;
  uVar18 = uVar18 + uVar17;
  uVar24 = uVar24 ^ uVar18;
  uVar20 = uVar24 >> 0x18 | uVar24 << 0x28;
  uVar24 = uVar29 + lVar2 + uVar20;
  uVar17 = uVar17 ^ uVar24;
  uVar17 = uVar17 >> 0x10 | uVar17 << 0x30;
  uVar18 = uVar18 + uVar17;
  uVar20 = uVar20 ^ uVar18;
  uVar29 = uVar27 >> 0x20 | uVar27 << 0x20;
  uVar19 = uVar19 + uVar29;
  uVar33 = uVar33 ^ uVar19;
  uVar33 = uVar33 >> 0x18 | uVar33 << 0x28;
  uVar31 = uVar31 + lVar8 + uVar33;
  uVar29 = uVar29 ^ uVar31;
  uVar29 = uVar29 >> 0x10 | uVar29 << 0x30;
  uVar19 = uVar19 + uVar29;
  uVar33 = uVar33 ^ uVar19;
  uVar27 = uVar30 >> 0x20 | uVar30 << 0x20;
  uVar26 = uVar26 + uVar27;
  uVar21 = uVar21 ^ uVar26;
  uVar21 = uVar21 >> 0x18 | uVar21 << 0x28;
  uVar30 = uVar32 + lVar4 + uVar21;
  uVar27 = uVar27 ^ uVar30;
  uVar27 = uVar27 >> 0x10 | uVar27 << 0x30;
  uVar26 = uVar26 + uVar27;
  uVar21 = uVar26 ^ uVar21;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uVar28;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uVar27;
  auVar36 = vpunpcklqdq_avx(auVar38,auVar36);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uVar29;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = uVar17;
  auVar38 = vpunpcklqdq_avx(auVar41,auVar39);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = uVar31;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = uVar30;
  auVar39 = vpunpcklqdq_avx(auVar46,auVar47);
  auVar37._0_16_ = ZEXT116(0) * auVar36 + ZEXT116(1) * auVar38;
  auVar37._16_16_ = ZEXT116(1) * auVar36;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = uVar22;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar18;
  auVar36 = vpunpcklqdq_avx(auVar42,auVar43);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = uVar19;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = uVar26;
  auVar38 = vpunpcklqdq_avx(auVar44,auVar45);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = uVar25;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar24;
  auVar41 = vpunpcklqdq_avx(auVar48,auVar49);
  auVar34 = vinserti64x4_avx512f
                      (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar36,
                                           ZEXT116(0) * auVar36 + ZEXT116(1) * auVar38)),auVar37,1);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar33 >> 0x3f | uVar33 << 1;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = uVar20 >> 0x3f | uVar20 << 1;
  auVar36 = vpunpcklqdq_avx(auVar51,auVar50);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = uVar23 >> 0x3f | uVar23 << 1;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = uVar21 >> 0x3f | uVar21 << 1;
  auVar38 = vpunpcklqdq_avx(auVar53,auVar52);
  auVar40._0_16_ = ZEXT116(0) * auVar36 + ZEXT116(1) * auVar38;
  auVar40._16_16_ = ZEXT116(1) * auVar36;
  auVar35 = vinserti64x4_avx512f
                      (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar39,
                                           ZEXT116(0) * auVar39 + ZEXT116(1) * auVar41)),auVar40,1);
  auVar34 = vpternlogq_avx512f(auVar35,auVar34,*(undefined1 (*) [64])(md->blake2b).h,0x96);
  auVar34 = vmovdqu64_avx512f(auVar34);
  *(undefined1 (*) [64])(md->blake2b).h = auVar34;
  return (int)md;
}

Assistant:

static int blake2b_compress(hash_state *md, const unsigned char *buf)
#endif
{
   ulong64 m[16];
   ulong64 v[16];
   unsigned long i;

   for (i = 0; i < 16; ++i) {
      LOAD64L(m[i], buf + i * sizeof(m[i]));
   }

   for (i = 0; i < 8; ++i) {
      v[i] = md->blake2b.h[i];
   }

   v[8] = blake2b_IV[0];
   v[9] = blake2b_IV[1];
   v[10] = blake2b_IV[2];
   v[11] = blake2b_IV[3];
   v[12] = blake2b_IV[4] ^ md->blake2b.t[0];
   v[13] = blake2b_IV[5] ^ md->blake2b.t[1];
   v[14] = blake2b_IV[6] ^ md->blake2b.f[0];
   v[15] = blake2b_IV[7] ^ md->blake2b.f[1];

   ROUND(0);
   ROUND(1);
   ROUND(2);
   ROUND(3);
   ROUND(4);
   ROUND(5);
   ROUND(6);
   ROUND(7);
   ROUND(8);
   ROUND(9);
   ROUND(10);
   ROUND(11);

   for (i = 0; i < 8; ++i) {
      md->blake2b.h[i] = md->blake2b.h[i] ^ v[i] ^ v[i + 8];
   }
   return CRYPT_OK;
}